

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O3

MPP_RET vcodec_service_reg_wr(void *ctx,MppDevRegWrCfg *cfg)

{
  int iVar1;
  RK_U32 RVar2;
  
  iVar1 = *(int *)((long)ctx + 0x1c);
  if (cfg->offset != 0) {
    _mpp_log_l(2,"vcodec_service","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->offset == 0",
               "vcodec_service_reg_wr",0x255);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  *(void **)((long)ctx + (long)iVar1 * 0xa0 + 0xb8) = cfg->reg;
  RVar2 = cfg->size;
  *(RK_U32 *)((long)ctx + (long)iVar1 * 0xa0 + 0x28) = RVar2;
  if (*(RK_U32 *)((long)ctx + 0x18) != RVar2) {
    _mpp_log_l(2,"vcodec_service","reg size mismatch wr %d rd %d\n","vcodec_service_reg_wr");
  }
  return MPP_OK;
}

Assistant:

MPP_RET vcodec_service_reg_wr(void *ctx, MppDevRegWrCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *send_cfg = &p->regs[p->reg_send_idx];

    mpp_assert(cfg->offset == 0);
    send_cfg->reg_set = cfg->reg;
    send_cfg->reg_size = cfg->size;

    if (p->reg_size != cfg->size)
        mpp_err_f("reg size mismatch wr %d rd %d\n",
                  p->reg_size, cfg->size);

    return MPP_OK;
}